

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void template_conform(t_template *tfrom,t_template *tto)

{
  uint uVar1;
  uint uVar2;
  t_dataslot *ptVar3;
  bool bVar4;
  int iVar5;
  int *conformaction;
  void *fatso;
  ulong uVar6;
  _glist *glist;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = tto->t_n;
  uVar2 = tfrom->t_n;
  conformaction = (int *)getbytes((long)(int)uVar1 << 2);
  fatso = getbytes((long)(int)uVar2 << 2);
  uVar6 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    conformaction[uVar6] = -1;
  }
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined4 *)((long)fatso + uVar6 * 4) = 0;
  }
  for (uVar6 = 0; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    ptVar3 = tto->t_vec;
    lVar9 = 0;
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      iVar5 = dataslot_matches(ptVar3 + uVar6,(t_dataslot *)((long)&tfrom->t_vec->ds_type + lVar9),1
                              );
      if (iVar5 != 0) {
        conformaction[uVar6] = (int)uVar10;
        *(undefined4 *)((long)fatso + uVar10 * 4) = 1;
      }
      lVar9 = lVar9 + 0x18;
    }
  }
  for (uVar6 = 0; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    if (conformaction[uVar6] < 0) {
      ptVar3 = tto->t_vec;
      lVar9 = 0;
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if ((*(int *)((long)fatso + uVar10 * 4) == 0) &&
           (iVar5 = dataslot_matches(ptVar3 + uVar6,
                                     (t_dataslot *)((long)&tfrom->t_vec->ds_type + lVar9),0),
           iVar5 != 0)) {
          conformaction[uVar6] = (int)uVar10;
          *(undefined4 *)((long)fatso + uVar10 * 4) = 1;
        }
        lVar9 = lVar9 + 0x18;
      }
    }
  }
  if (uVar1 == uVar2) {
    bVar4 = false;
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      if (uVar6 != (uint)conformaction[uVar6]) {
        bVar4 = true;
      }
    }
    if (!bVar4) goto LAB_001529d2;
  }
  for (glist = pd_getcanvaslist(); glist != (_glist *)0x0; glist = glist->gl_next) {
    template_conformglist(tfrom,tto,glist,conformaction);
  }
LAB_001529d2:
  freebytes(conformaction,(long)(int)uVar1 << 2);
  freebytes(fatso,(long)(int)uVar2 << 2);
  return;
}

Assistant:

void template_conform(t_template *tfrom, t_template *tto)
{
    int nto = tto->t_n, nfrom = tfrom->t_n, i, j,
        *conformaction = (int *)getbytes(sizeof(int) * nto),
        *conformedfrom = (int *)getbytes(sizeof(int) * nfrom), doit = 0;
    for (i = 0; i < nto; i++)
        conformaction[i] = -1;
    for (i = 0; i < nfrom; i++)
        conformedfrom[i] = 0;
    for (i = 0; i < nto; i++)
    {
        t_dataslot *dataslot = &tto->t_vec[i];
        for (j = 0; j < nfrom; j++)
        {
            t_dataslot *dataslot2 = &tfrom->t_vec[j];
            if (dataslot_matches(dataslot, dataslot2, 1))
            {
                conformaction[i] = j;
                conformedfrom[j] = 1;
            }
        }
    }
    for (i = 0; i < nto; i++)
        if (conformaction[i] < 0)
    {
        t_dataslot *dataslot = &tto->t_vec[i];
        for (j = 0; j < nfrom; j++)
            if (!conformedfrom[j] &&
                dataslot_matches(dataslot, &tfrom->t_vec[j], 0))
        {
            conformaction[i] = j;
            conformedfrom[j] = 1;
        }
    }
    if (nto != nfrom)
        doit = 1;
    else for (i = 0; i < nto; i++)
        if (conformaction[i] != i)
            doit = 1;

    if (doit)
    {
        t_glist *gl;
        for (gl = pd_getcanvaslist(); gl; gl = gl->gl_next)
            template_conformglist(tfrom, tto, gl, conformaction);
    }
    freebytes(conformaction, sizeof(int) * nto);
    freebytes(conformedfrom, sizeof(int) * nfrom);
}